

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp
# Opt level: O0

void __thiscall
glcts::InvalidTextureSizesAreRejectedValidAreAcceptedTest::deinit
          (InvalidTextureSizesAreRejectedValidAreAcceptedTest *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  InvalidTextureSizesAreRejectedValidAreAcceptedTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->gl_oes_texture_multisample_2d_array_supported != '\0') {
    (**(code **)(lVar3 + 0xb8))(0x9102,0);
  }
  if (this->to_id_2d_array_1 != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->to_id_2d_array_1);
    this->to_id_2d_array_1 = 0;
  }
  if (this->to_id_2d_array_2 != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->to_id_2d_array_2);
    this->to_id_2d_array_2 = 0;
  }
  if (this->to_id_2d_array_3 != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->to_id_2d_array_3);
    this->to_id_2d_array_3 = 0;
  }
  this->max_texture_size = 0;
  this->max_array_texture_layers = 0;
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"Texture objects deletion failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                  ,0x92);
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void InvalidTextureSizesAreRejectedValidAreAcceptedTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (gl_oes_texture_multisample_2d_array_supported)
	{
		/* Bind default texture object to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target. */
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 0);
	}

	if (to_id_2d_array_1 != 0)
	{
		/* Delete texture object. */
		gl.deleteTextures(1, &to_id_2d_array_1);

		to_id_2d_array_1 = 0;
	}

	if (to_id_2d_array_2 != 0)
	{
		/* Delete texture object. */
		gl.deleteTextures(1, &to_id_2d_array_2);

		to_id_2d_array_2 = 0;
	}

	if (to_id_2d_array_3 != 0)
	{
		/* Delete texture object. */
		gl.deleteTextures(1, &to_id_2d_array_3);

		to_id_2d_array_3 = 0;
	}

	max_texture_size		 = 0;
	max_array_texture_layers = 0;

	/* Make sure no error was generated. */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture objects deletion failed.");

	/* Call base class' deinit() */
	TestCase::deinit();
}